

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_debug.hh
# Opt level: O2

void def_trace<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>
               (class_<kratos::Var,_std::shared_ptr<kratos::Var>_> *class_)

{
  class_<kratos::Var,std::shared_ptr<kratos::Var>> *pcVar1;
  type local_13;
  type local_12;
  anon_class_1_0_00000001 local_11;
  
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<def_trace<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::_lambda(kratos::Var&,std::pair<std::__cxx11::string,unsigned_int>const&)_1_>
                     ((class_<kratos::Var,std::shared_ptr<kratos::Var>> *)class_,"add_fn_ln",
                      &local_13);
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<def_trace<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::_lambda(kratos::Var&,std::pair<std::__cxx11::string,unsigned_int>const&,bool)_1_>
                     (pcVar1,"add_fn_ln",&local_12);
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def_readwrite<kratos::IRNode,std::__cxx11::string>(pcVar1,"comment",0x28);
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def_readwrite<kratos::IRNode,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
                     (pcVar1,"fn_name_ln",8);
  pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
  def_property_readonly<def_trace<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::_lambda(kratos::Var&)_1_>
            (pcVar1,"verilog_ln",&local_11);
  return;
}

Assistant:

void def_trace(T &class_) {
    class_.def("add_fn_ln", [](K &var, const std::pair<std::string, uint32_t> &info) {
      var.fn_name_ln.emplace_back(info);
    })
    .def("add_fn_ln", [](K &var, const std::pair<std::string, uint32_t> &info, bool insert_front) {
        if (insert_front) {
            var.fn_name_ln.insert(var.fn_name_ln.begin(), info);
        } else {
            var.fn_name_ln.emplace_back(info);
        }
    })
    .def_readwrite("comment", &K::comment)
    .def_readwrite("fn_name_ln", &K::fn_name_ln)
    .def_property_readonly("verilog_ln", [](K& k) { return k.verilog_ln; });
}